

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerCondBranchCheckBailOut
          (Lowerer *this,BranchInstr *branchInstr,Instr *helperCall,bool isHelper)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  Instr *this_00;
  BailOutInfo *bailOutInfo_00;
  BailOutInstrTemplate<IR::Instr> *instr;
  Instr *pIVar5;
  BailOutInstr *debuggerBailoutInstr;
  BailOutInfo *bailOutInfo;
  Instr *prevInstr;
  Instr *bailOutInstr;
  BailOutKind debuggerBailOutKind;
  bool isHelper_local;
  Instr *helperCall_local;
  BranchInstr *branchInstr_local;
  Lowerer *this_local;
  
  if (((branchInstr->super_Instr).m_opcode != BrTrue_A) &&
     ((branchInstr->super_Instr).m_opcode != BrFalse_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3078,
                       "(branchInstr->m_opcode == Js::OpCode::BrTrue_A || branchInstr->m_opcode == Js::OpCode::BrFalse_A)"
                       ,
                       "branchInstr->m_opcode == Js::OpCode::BrTrue_A || branchInstr->m_opcode == Js::OpCode::BrFalse_A"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Instr::HasBailOutInfo(&branchInstr->super_Instr);
  if (bVar2) {
    bailOutInstr._0_4_ = BailOutInvalid;
    bVar2 = IR::Instr::HasAuxBailOut(&branchInstr->super_Instr);
    if (bVar2) {
      BVar3 = IR::Instr::GetBailOutKind(&branchInstr->super_Instr);
      BVar3 = IR::operator&(BVar3,BailOutForDebuggerBits);
      bVar2 = IR::operator!(BVar3);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3081,"(!(branchInstr->GetBailOutKind() & IR::BailOutForDebuggerBits))"
                           ,"There should be no debugger bits in main bailout kind.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      BVar3 = IR::Instr::GetAuxBailOutKind(&branchInstr->super_Instr);
      bailOutInstr._0_4_ = IR::operator&(BVar3,BailOutForDebuggerBits);
      BVar3 = IR::operator|(BailOutIgnoreException,BailOutForceByFlag);
      BVar3 = IR::operator~(BVar3);
      BVar3 = IR::operator&((BailOutKind)bailOutInstr,BVar3);
      if (BVar3 != BailOutInvalid) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3084,
                           "((debuggerBailOutKind & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0)"
                           ,"Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    pIVar5 = SplitBailOnImplicitCall
                       (this,&branchInstr->super_Instr,helperCall,&branchInstr->super_Instr);
    this_00 = LowerBailOnEqualOrNotEqual
                        (this,pIVar5,branchInstr,(LabelInstr *)0x0,(PropertySymOpnd *)0x0,isHelper);
    if ((BailOutKind)bailOutInstr != BailOutInvalid) {
      bailOutInfo_00 = IR::Instr::GetBailOutInfo(pIVar5);
      instr = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailForDebugger,(BailOutKind)bailOutInstr,bailOutInfo_00,
                         bailOutInfo_00->bailOutFunc);
      IR::Instr::InsertAfter(this_00,&instr->super_Instr);
      LowerBailForDebugger(this,&instr->super_Instr,isHelper);
    }
  }
  pIVar5 = LowererMD::LowerCondBranch(&this->m_lowererMD,&branchInstr->super_Instr);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerCondBranchCheckBailOut(IR::BranchInstr * branchInstr, IR::Instr * helperCall, bool isHelper)
{
    Assert(branchInstr->m_opcode == Js::OpCode::BrTrue_A || branchInstr->m_opcode == Js::OpCode::BrFalse_A);
    if (branchInstr->HasBailOutInfo())
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        IR::BailOutKind debuggerBailOutKind = IR::BailOutInvalid;
        if (branchInstr->HasAuxBailOut())
        {
            // We have shared debugger bailout. For branches we lower it here, not in SplitBailForDebugger.
            // See SplitBailForDebugger for details.
            AssertMsg(!(branchInstr->GetBailOutKind() & IR::BailOutForDebuggerBits), "There should be no debugger bits in main bailout kind.");

            debuggerBailOutKind = branchInstr->GetAuxBailOutKind() & IR::BailOutForDebuggerBits;
            AssertMsg((debuggerBailOutKind & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0, "Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        }
#endif

        IR::Instr * bailOutInstr = this->SplitBailOnImplicitCall(branchInstr, helperCall, branchInstr);
        IR::Instr* prevInstr = this->LowerBailOnEqualOrNotEqual(bailOutInstr, branchInstr, nullptr, nullptr, isHelper);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (debuggerBailOutKind != IR::BailOutInvalid)
        {
            // Note that by this time implicit calls bailout is already lowered.
            // What we do here is use same bailout info and lower debugger bailout which would be shared bailout.
            BailOutInfo* bailOutInfo = bailOutInstr->GetBailOutInfo();
            IR::BailOutInstr* debuggerBailoutInstr = IR::BailOutInstr::New(
                Js::OpCode::BailForDebugger, debuggerBailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);
            prevInstr->InsertAfter(debuggerBailoutInstr);
            // The result of that is:
            // original helper op_* instr, then debugger bailout, then implicit calls bailout/etc with the branch instr.
            // Example:
            //    s35(eax).i32    =  CALL           Op_GreaterEqual.u32                     # -- original op_* helper
            //    s34.i32         =  MOV            s35(eax).i32                            #
            //                       BailForDebugger                                        # Bailout: #0042 (BailOutIgnoreException) -- the debugger bailout
            //                       CMP            [0x0003BDE0].i8, 1 (0x1).i8             # -- implicit calls check
            //                       JEQ            $L10                                    #
            //$L11: [helper]                                                                #
            //                       CALL           SaveAllRegistersAndBranchBailOut.u32    # Bailout: #0042 (BailOutOnImplicitCalls)
            //                       JMP            $L5                                     #
            //$L10: [helper]                                                                #
            //                       BrFalse_A      $L3, s34.i32                            #0034 -- The BrTrue/BrFalse branch (branch instr)
            //$L6: [helper]                                                                 #0042

            this->LowerBailForDebugger(debuggerBailoutInstr, isHelper);
            // After lowering this we will have a check which on bailout condition will JMP to $L11.
        }
#else
        (prevInstr);
#endif
    }

    return m_lowererMD.LowerCondBranch(branchInstr);
}